

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_stages
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *stages,
          VkPipelineShaderStageCreateInfo **out_info)

{
  pointer __n;
  iterator iVar1;
  bool bVar2;
  SizeType SVar3;
  uint uVar4;
  VkShaderStageFlagBits VVar5;
  VkPipelineShaderStageCreateInfo *pVVar6;
  ConstValueIterator pGVar7;
  Type pGVar8;
  Ch *pCVar9;
  char *pcVar10;
  uchar *buffer_;
  size_type total_size;
  pointer ppVar11;
  VkShaderModule_T *pVVar12;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false> local_a8;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false> local_a0;
  int local_98;
  allocator<unsigned_char> local_91;
  undefined1 local_90 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  size_t external_state_size;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false> local_68;
  iterator module_iter;
  uint64_t module;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *obj
  ;
  ConstValueIterator itr;
  VkPipelineShaderStageCreateInfo *ret;
  VkPipelineShaderStageCreateInfo *state;
  VkPipelineShaderStageCreateInfo **out_info_local;
  Value *stages_local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  SVar3 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(stages);
  pVVar6 = ScratchAllocator::allocate_n_cleared<VkPipelineShaderStageCreateInfo>
                     (&this->allocator,(ulong)SVar3);
  obj = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::Begin(stages);
  ret = pVVar6;
  do {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(stages);
    if (obj == pGVar7) {
      *out_info = pVVar6;
      this_local._7_1_ = 1;
LAB_0013b2cc:
      return (bool)(this_local._7_1_ & 1);
    }
    ret->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"flags");
    uVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar8);
    ret->flags = uVar4;
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"stage");
    VVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar8);
    ret->stage = VVar5;
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"name");
    pCVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pGVar8);
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"name");
    SVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength(pGVar8);
    pcVar10 = duplicate_string(this,pCVar9,(ulong)SVar3);
    ret->pName = pcVar10;
    bVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(obj,"specializationInfo");
    if (bVar2) {
      pGVar8 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"specializationInfo");
      bVar2 = parse_specialization_info(this,pGVar8,&ret->pSpecializationInfo);
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_0013b2cc;
      }
    }
    bVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember(obj,"pNext");
    if (bVar2) {
      pGVar8 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)obj,"pNext");
      bVar2 = parse_pnext_chain(this,pGVar8,&ret->pNext,(StateCreatorInterface *)0x0,
                                (DatabaseInterface *)0x0,(Value *)0x0);
      if (!bVar2) {
        this_local._7_1_ = 0;
        goto LAB_0013b2cc;
      }
    }
    pGVar8 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)obj,"module");
    pCVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pGVar8);
    module_iter.super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>)
              string_to_uint64(pCVar9);
    if ((module_iter.
         super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>._M_cur
         == (__node_type *)0x0) || ((this->resolve_shader_modules & 1U) == 0)) {
      pVVar12 = api_object_cast<VkShaderModule_T*,unsigned_long>
                          ((unsigned_long)
                           module_iter.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                           ._M_cur);
      ret->module = pVVar12;
    }
    else {
      local_68._M_cur =
           (__node_type *)
           std::
           unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
           ::find(&this->replayed_shader_modules,(key_type *)&module_iter);
      external_state_size =
           (size_t)std::
                   unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
                   ::end(&this->replayed_shader_modules);
      bVar2 = std::__detail::operator==
                        (&local_68,
                         (_Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                          *)&external_state_size);
      if (bVar2) {
        external_state.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((resolver == (DatabaseInterface *)0x0) ||
           (uVar4 = (*resolver->_vptr_DatabaseInterface[3])
                              (resolver,4,
                               module_iter.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                               ._M_cur,&external_state.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0),
           __n = external_state.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage, (uVar4 & 1) == 0)) {
          log_missing_resource
                    ("Shader module",
                     (Hash)module_iter.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                           ._M_cur);
          this_local._7_1_ = 0;
          goto LAB_0013b2cc;
        }
        std::allocator<unsigned_char>::allocator(&local_91);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,(size_type)__n,
                   &local_91);
        std::allocator<unsigned_char>::~allocator(&local_91);
        iVar1 = module_iter;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
        uVar4 = (*resolver->_vptr_DatabaseInterface[3])
                          (resolver,4,
                           iVar1.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                           ._M_cur,&external_state.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((uVar4 & 1) == 0) {
          log_missing_resource
                    ("Shader module",
                     (Hash)module_iter.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                           ._M_cur);
          this_local._7_1_ = 0;
          local_98 = 1;
        }
        else {
          buffer_ = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
          total_size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90)
          ;
          bVar2 = parse(this,iface,resolver,buffer_,total_size);
          if (bVar2) {
            (*iface->_vptr_StateCreatorInterface[0xf])();
            local_a0._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
                 ::find(&this->replayed_shader_modules,(key_type *)&module_iter);
            local_68._M_cur = local_a0._M_cur;
            local_a8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<unsigned_long,_VkShaderModule_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>_>
                 ::end(&this->replayed_shader_modules);
            bVar2 = std::__detail::operator==(&local_68,&local_a8);
            if (bVar2) {
              log_missing_resource
                        ("Shader module",
                         (Hash)module_iter.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                               ._M_cur);
              this_local._7_1_ = 0;
              local_98 = 1;
            }
            else {
              local_98 = 0;
            }
          }
          else {
            this_local._7_1_ = 0;
            local_98 = 1;
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90);
        if (local_98 != 0) goto LAB_0013b2cc;
      }
      else {
        (*iface->_vptr_StateCreatorInterface[0xf])();
      }
      ppVar11 = std::__detail::
                _Node_iterator<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false,_false>::
                operator->((_Node_iterator<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false,_false>
                            *)&local_68);
      ret->module = ppVar11->second;
    }
    obj = obj + 1;
    ret = ret + 1;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_stages(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &stages,
                                       const VkPipelineShaderStageCreateInfo **out_info)
{
	auto *state = allocator.allocate_n_cleared<VkPipelineShaderStageCreateInfo>(stages.Size());
	auto *ret = state;

	for (auto itr = stages.Begin(); itr != stages.End(); ++itr, state++)
	{
		auto &obj = *itr;
		state->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
		state->flags = obj["flags"].GetUint();
		state->stage = static_cast<VkShaderStageFlagBits>(obj["stage"].GetUint());
		state->pName = duplicate_string(obj["name"].GetString(), obj["name"].GetStringLength());
		if (obj.HasMember("specializationInfo"))
			if (!parse_specialization_info(obj["specializationInfo"], &state->pSpecializationInfo))
				return false;

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &state->pNext))
				return false;

		auto module = string_to_uint64(obj["module"].GetString());
		if (module > 0 && resolve_shader_modules)
		{
			auto module_iter = replayed_shader_modules.find(module);
			if (module_iter == replayed_shader_modules.end())
			{
				size_t external_state_size = 0;
				if (!resolver || !resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, nullptr,
				                                       PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Shader module", module);
					return false;
				}

				vector<uint8_t> external_state(external_state_size);

				if (!resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, external_state.data(),
				                          PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Shader module", module);
					return false;
				}

				if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
					return false;

				iface.sync_shader_modules();
				module_iter = replayed_shader_modules.find(module);
				if (module_iter == replayed_shader_modules.end())
				{
					log_missing_resource("Shader module", module);
					return false;
				}
			}
			else
				iface.sync_shader_modules();

			state->module = module_iter->second;
		}
		else
			state->module = api_object_cast<VkShaderModule>(module);
	}

	*out_info = ret;
	return true;
}